

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::NextBuffer<false>
          (EpsCopyInputStream *this,int overrun,int depth)

{
  char *this_00;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int in_ECX;
  char *pcVar4;
  undefined4 in_register_00000034;
  size_t __n;
  void *data;
  char *local_50;
  int local_34;
  
  pcVar4 = this->next_chunk_;
  if (pcVar4 == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    this_00 = this->patch_buffer_;
    if (pcVar4 == this_00) {
      uVar1 = *(undefined8 *)(this->buffer_end_ + 8);
      *(undefined8 *)this_00 = *(undefined8 *)this->buffer_end_;
      *(undefined8 *)(this->patch_buffer_ + 8) = uVar1;
      if ((0 < this->overall_limit_) &&
         ((depth < 0 ||
          (bVar2 = ParseEndsInSlopRegion<false>
                             ((EpsCopyInputStream *)this_00,
                              (char *)CONCAT44(in_register_00000034,overrun),depth,in_ECX), !bVar2))
         )) {
        do {
          iVar3 = (*this->zcis_->_vptr_ZeroCopyInputStream[2])(this->zcis_,&local_50,&this->size_);
          if ((char)iVar3 == '\0') {
            this->overall_limit_ = 0;
            goto LAB_00fa6bef;
          }
          iVar3 = this->size_;
          __n = (size_t)iVar3;
          this->overall_limit_ = this->overall_limit_ - iVar3;
          if (0x10 < (long)__n) {
            uVar1 = *(undefined8 *)(local_50 + 8);
            *(undefined8 *)(this->patch_buffer_ + 0x10) = *(undefined8 *)local_50;
            *(undefined8 *)(this->patch_buffer_ + 0x18) = uVar1;
            this->next_chunk_ = local_50;
            this->buffer_end_ = this->patch_buffer_ + 0x10;
LAB_00fa6c62:
            if (this->aliasing_ < 2) {
              return this_00;
            }
            this->aliasing_ = 1;
            return this_00;
          }
          if (0 < iVar3) {
            memcpy(this->patch_buffer_ + 0x10,local_50,__n);
            this->next_chunk_ = this_00;
            this->buffer_end_ = this_00 + __n;
            goto LAB_00fa6c62;
          }
        } while (iVar3 == 0);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&stack0xffffffffffffffb8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
                   ,0x86,"size_ == 0");
        local_34 = this->size_;
        absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>
                  ((LogMessage *)&stack0xffffffffffffffb8,&stack0xffffffffffffffcc);
LAB_00fa6c80:
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&stack0xffffffffffffffb8);
      }
LAB_00fa6bef:
      if (this->aliasing_ == 2) {
        this->aliasing_ = (long)this->buffer_end_ - (long)pcVar4;
      }
      this->next_chunk_ = (char *)0x0;
      this->buffer_end_ = this->patch_buffer_ + 0x10;
      this->size_ = 0;
      pcVar4 = this_00;
    }
    else {
      if ((long)this->size_ < 0x11) {
        NextBuffer<false>((EpsCopyInputStream *)&stack0xffffffffffffffb8);
        goto LAB_00fa6c80;
      }
      this->buffer_end_ = pcVar4 + (long)this->size_ + -0x10;
      this->next_chunk_ = this_00;
      if (this->aliasing_ == 1) {
        this->aliasing_ = 2;
      }
    }
  }
  return pcVar4;
}

Assistant:

const char* EpsCopyInputStream::NextBuffer(int overrun, int depth) {
  if (next_chunk_ == nullptr) return nullptr;  // We've reached end of stream.
  if (next_chunk_ != patch_buffer_) {
    ABSL_DCHECK(size_ > kSlopBytes);
    // The chunk is large enough to be used directly
    buffer_end_ = next_chunk_ + size_ - kSlopBytes;
    auto res = next_chunk_;
    next_chunk_ = patch_buffer_;
    if (aliasing_ == kOnPatch) aliasing_ = kNoDelta;
    return res;
  }
  // Move the slop bytes of previous buffer to start of the patch buffer.
  // Note we must use memmove because the previous buffer could be part of
  // patch_buffer_.
  std::memmove(patch_buffer_, buffer_end_, kSlopBytes);
  if (overall_limit_ > 0 &&
      (depth < 0 || !ParseEndsInSlopRegion<kExperimentalV2>(patch_buffer_,
                                                            overrun, depth))) {
    const void* data;
    // ZeroCopyInputStream indicates Next may return 0 size buffers. Hence
    // we loop.
    while (StreamNext(&data)) {
      if (size_ > kSlopBytes) {
        // We got a large chunk
        std::memcpy(patch_buffer_ + kSlopBytes, data, kSlopBytes);
        next_chunk_ = static_cast<const char*>(data);
        buffer_end_ = patch_buffer_ + kSlopBytes;
        if (aliasing_ >= kNoDelta) aliasing_ = kOnPatch;
        return patch_buffer_;
      } else if (size_ > 0) {
        std::memcpy(patch_buffer_ + kSlopBytes, data, size_);
        next_chunk_ = patch_buffer_;
        buffer_end_ = patch_buffer_ + size_;
        if (aliasing_ >= kNoDelta) aliasing_ = kOnPatch;
        return patch_buffer_;
      }
      ABSL_DCHECK(size_ == 0) << size_;
    }
    overall_limit_ = 0;  // Next failed, no more needs for next
  }
  // End of stream or array
  if (aliasing_ == kNoDelta) {
    // If there is no more block and aliasing is true, the previous block
    // is still valid and we can alias. We have users relying on string_view's
    // obtained from protos to outlive the proto, when the parse was from an
    // array. This guarantees string_view's are always aliased if parsed from
    // an array.
    aliasing_ = reinterpret_cast<std::uintptr_t>(buffer_end_) -
                reinterpret_cast<std::uintptr_t>(patch_buffer_);
  }
  next_chunk_ = nullptr;
  buffer_end_ = patch_buffer_ + kSlopBytes;
  size_ = 0;
  return patch_buffer_;
}